

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

uchar * golf_base64_decode(uchar *src,int len,int *out_len)

{
  byte *pbVar1;
  int local_150;
  int pad;
  int olen;
  int count;
  int i;
  uchar tmp;
  byte *pbStack_138;
  uchar block [4];
  uchar *pos;
  uchar *out;
  uchar dtable [256];
  int *out_len_local;
  int len_local;
  uchar *src_local;
  
  local_150 = 0;
  dtable._248_8_ = out_len;
  memset(&out,0x80,0x100);
  for (olen = 0; olen < 0x40; olen = olen + 1) {
    dtable[(ulong)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[olen] - 8] =
         (uchar)olen;
  }
  dtable[0x35] = '\0';
  pad = 0;
  for (olen = 0; olen < len; olen = olen + 1) {
    if (dtable[(ulong)src[olen] - 8] != 0x80) {
      pad = pad + 1;
    }
  }
  if ((pad == 0) || (pad % 4 != 0)) {
    src_local = (uchar *)0x0;
  }
  else {
    src_local = (uchar *)golf_alloc_tracked((long)((pad / 4) * 3),
                                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/base64.c"
                                           );
    if (src_local == (byte *)0x0) {
      src_local = (uchar *)0x0;
    }
    else {
      pad = 0;
      pbStack_138 = src_local;
      for (olen = 0; olen < len; olen = olen + 1) {
        pbVar1 = pbStack_138;
        if (dtable[(ulong)src[olen] - 8] != 0x80) {
          if (src[olen] == '=') {
            local_150 = local_150 + 1;
          }
          *(uchar *)((long)&i + (long)pad) = dtable[(ulong)src[olen] - 8];
          pad = pad + 1;
          if (pad == 4) {
            *pbStack_138 = (char)i << 2 | (byte)((int)(uint)i._1_1_ >> 4);
            pbStack_138[1] = i._1_1_ << 4 | (byte)((int)(uint)i._2_1_ >> 2);
            pbStack_138[2] = i._2_1_ << 6 | i._3_1_;
            pad = 0;
            pbVar1 = pbStack_138 + 3;
            if (local_150 != 0) {
              if (local_150 == 1) {
                pbStack_138 = pbStack_138 + 2;
              }
              else {
                if (local_150 != 2) {
                  pbStack_138 = pbStack_138 + 3;
                  golf_free_tracked(src_local);
                  return (uchar *)0x0;
                }
                pbStack_138 = pbStack_138 + 1;
              }
              break;
            }
          }
        }
        pbStack_138 = pbVar1;
      }
      *(int *)dtable._248_8_ = (int)pbStack_138 - (int)src_local;
    }
  }
  return src_local;
}

Assistant:

unsigned char * golf_base64_decode(const unsigned char *src, int len,
                  int *out_len)
{
    unsigned char dtable[256], *out, *pos, block[4], tmp;
    int i, count, olen;
    int pad = 0;

    memset(dtable, 0x80, 256);
    for (i = 0; i < (int)sizeof(base64_table) - 1; i++)
        dtable[base64_table[i]] = (unsigned char) i;
    dtable['='] = 0;

    count = 0;
    for (i = 0; i < len; i++) {
        if (dtable[src[i]] != 0x80)
            count++;
    }

    if (count == 0 || count % 4)
        return NULL;

    olen = count / 4 * 3;
    pos = out = golf_alloc(olen);
    if (out == NULL)
        return NULL;

    count = 0;
    for (i = 0; i < len; i++) {
        tmp = dtable[src[i]];
        if (tmp == 0x80)
            continue;

        if (src[i] == '=')
            pad++;
        block[count] = tmp;
        count++;
        if (count == 4) {
            *pos++ = (block[0] << 2) | (block[1] >> 4);
            *pos++ = (block[1] << 4) | (block[2] >> 2);
            *pos++ = (block[2] << 6) | block[3];
            count = 0;
            if (pad) {
                if (pad == 1)
                    pos--;
                else if (pad == 2)
                    pos -= 2;
                else {
                    /* Invalid padding */
                    golf_free(out);
                    return NULL;
                }
                break;
            }
        }
    }

    *out_len = (int)(pos - out);
    return out;
}